

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_flonum_to_fixnum(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t lab;
  operand local_d0;
  operation local_cc [2];
  operand local_c4 [2];
  operation local_bc;
  operand local_b8 [2];
  operation local_b0;
  operand local_ac [2];
  operation local_a4 [2];
  operand local_9c [2];
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  this = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,this,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_short_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_short_if_arg_does_not_point_to_flonum(code,RCX,R11,(string *)local_38);
  }
  local_94 = MOV;
  local_9c[1] = 9;
  local_9c[0] = MEM_RCX;
  local_a4[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_94,local_9c + 1,local_9c,(int *)(local_a4 + 1));
  local_a4[0] = MOVQ;
  local_ac[1] = 0x43;
  local_ac[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_a4,local_ac + 1,local_ac);
  local_b0 = CVTTSD2SI;
  local_b8[1] = 9;
  local_b8[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_b0,local_b8 + 1,local_b8);
  local_bc = SHL;
  local_c4[1] = 9;
  local_c4[0] = NUMBER;
  local_cc[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_bc,local_c4 + 1,local_c4,(int *)(local_cc + 1));
  local_cc[0] = JMP;
  local_d0 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_cc,&local_d0);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_flonum_to_fixnum_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_flonum_to_fixnum(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::MOVQ, asmcode::XMM0, asmcode::RAX);
  code.add(asmcode::CVTTSD2SI, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_flonum_to_fixnum_contract_violation);
    }
  }